

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O0

Pass * wasm::createConstantFieldPropagationRefTestPass(void)

{
  ConstantFieldPropagation *this;
  
  this = (ConstantFieldPropagation *)operator_new(0x60);
  anon_unknown_173::ConstantFieldPropagation::ConstantFieldPropagation(this,true);
  return &this->super_Pass;
}

Assistant:

Pass* createConstantFieldPropagationRefTestPass() {
  return new ConstantFieldPropagation(true);
}